

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deprecation-warning.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  long lVar1;
  undefined8 uVar2;
  undefined8 *in_RSI;
  int in_EDI;
  size_t pos;
  string filename;
  string local_70 [32];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator(&local_31);
  if (0 < local_8) {
    std::__cxx11::string::operator=(local_30,(char *)*local_10);
  }
  lVar1 = std::__cxx11::string::find_last_of((char *)local_30,0x103009);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_30);
    std::__cxx11::string::operator=(local_30,local_70);
    std::__cxx11::string::~string(local_70);
  }
  fprintf(_stdout,"\n");
  __stream = _stdout;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"WARNING: The binary \'%s\' is deprecated.\n",uVar2);
  fprintf(_stdout,"Please use \'llama-mtmd-cli\' instead.\n");
  fprintf(_stdout,"\n");
  local_4 = 1;
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    std::string filename = "main";
    if (argc >= 1) {
        filename = argv[0];
    }

    // Get only the program name from the full path
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
        filename = filename.substr(pos+1);
    }

    fprintf(stdout, "\n");
    fprintf(stdout, "WARNING: The binary '%s' is deprecated.\n", filename.c_str());
    fprintf(stdout, "Please use 'llama-mtmd-cli' instead.\n");
    fprintf(stdout, "\n");

    return EXIT_FAILURE;
}